

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baillie_test.hpp
# Opt level: O1

int D_chooser(int candidate)

{
  bool bVar1;
  int iVar2;
  int n;
  
  n = 5;
  iVar2 = jacobiSymbol(5,candidate);
  if (iVar2 != -1) {
    n = 5;
    do {
      bVar1 = n < 1;
      n = -2 - n;
      if (bVar1) {
        n = 2;
      }
      iVar2 = jacobiSymbol(n,candidate);
    } while (iVar2 != -1);
  }
  return n;
}

Assistant:

int D_chooser(int candidate) {
    int D = 5;
    while ( jacobiSymbol(D, candidate) != -1 ){
        if (D > 0 ) {
            D +=2;
        }else {
            D = -2;
        }
        D *= -1;
    }
    return D;
}